

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_edge_detection.cpp
# Opt level: O0

bool edge_detection::DetectVerticalEdge<double>(void)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  size_type sVar4;
  pointer pPVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_ZMM1 [64];
  const_iterator point_1;
  const_iterator point;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *negative;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *positive;
  EdgeDetectionBase<double> edgeDetection;
  bool isValidBottomEdge;
  bool isValidTopEdge;
  uint32_t roiYEnd;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image image;
  uint32_t i;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  uint32_t in_stack_fffffffffffffeb0;
  undefined2 in_stack_fffffffffffffeb4;
  uint8_t in_stack_fffffffffffffeb6;
  uint8_t in_stack_fffffffffffffeb7;
  uint32_t in_stack_fffffffffffffeb8;
  uint32_t in_stack_fffffffffffffebc;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  undefined4 uVar11;
  bool local_119;
  bool local_111;
  __normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
  local_f8;
  PointBase2D<double> *local_f0;
  __normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
  local_e8;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *local_e0;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *local_d8;
  EdgeParameter local_d0;
  EdgeDetectionBase<double> local_b0;
  int local_80;
  bool local_7a;
  bool local_79;
  int local_78;
  int local_74;
  uint local_70;
  uint local_6c;
  undefined4 local_68;
  ImageTemplate<unsigned_char> local_30;
  uint local_8;
  byte local_1;
  
  for (local_8 = 0; uVar3 = local_8, uVar2 = Test_Helper::runCount(), uVar3 < uVar2;
      local_8 = local_8 + 1) {
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,
               in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb6);
    Unit_Test::blackImage((Image *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x187220);
    Unit_Test::generateRoi
              (in_stack_fffffffffffffec0,
               (uint32_t *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               (uint32_t *)
               CONCAT17(in_stack_fffffffffffffeb7,
                        CONCAT16(in_stack_fffffffffffffeb6,
                                 CONCAT24(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0))),
               (uint32_t *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
               (uint32_t *)0x18724d);
    local_78 = local_6c + local_74;
    local_111 = false;
    if (1 < local_6c) {
      uVar3 = local_6c + 1;
      uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_30);
      local_111 = uVar3 < uVar2;
    }
    local_79 = local_111;
    local_119 = false;
    if (local_6c != 0) {
      uVar3 = local_78 + 2;
      uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_30);
      local_119 = uVar3 < uVar2;
    }
    local_7a = local_119;
    if (((local_79 & 1U) == 0) && (local_119 == false)) {
      local_80 = 4;
    }
    else {
      uVar11 = local_68;
      uVar3 = local_6c;
      Test_Helper::randomValue<unsigned_char>(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0);
      Unit_Test::fillImage
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,
                 CONCAT13(in_stack_fffffffffffffeb7,
                          CONCAT12(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb4)),
                 in_stack_fffffffffffffeb0,(uint8_t)((uint)in_stack_fffffffffffffeac >> 0x18));
      EdgeDetectionBase<double>::EdgeDetectionBase
                ((EdgeDetectionBase<double> *)
                 CONCAT17(in_stack_fffffffffffffeb7,
                          CONCAT16(in_stack_fffffffffffffeb6,
                                   CONCAT24(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0))));
      in_stack_fffffffffffffeb8 = 10;
      in_stack_fffffffffffffeb0 = 0;
      in_stack_fffffffffffffea8 = 0;
      EdgeParameter::EdgeParameter(&local_d0,TOP_TO_BOTTOM,ANY,ALL,1,1,0,0,'\n');
      EdgeDetectionBase<double>::find
                ((EdgeDetectionBase<double> *)CONCAT44(uVar3,uVar11),
                 (Image *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 (EdgeParameter *)in_stack_fffffffffffffec0);
      local_d8 = EdgeDetectionBase<double>::positiveEdge(&local_b0);
      local_e0 = EdgeDetectionBase<double>::negativeEdge(&local_b0);
      if ((((local_79 & 1U) == 0) ||
          (sVar4 = std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::size
                             (local_d8), sVar4 == local_70)) &&
         (((local_7a & 1U) == 0 ||
          (sVar4 = std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::size
                             (local_e0), sVar4 == local_70)))) {
        local_e8._M_current =
             (PointBase2D<double> *)
             std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::cbegin
                       ((vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *)
                        CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        while( true ) {
          local_f0 = (PointBase2D<double> *)
                     std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::cend
                               ((vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
                              *)CONCAT17(in_stack_fffffffffffffeb7,
                                         CONCAT16(in_stack_fffffffffffffeb6,
                                                  CONCAT24(in_stack_fffffffffffffeb4,
                                                           in_stack_fffffffffffffeb0))),
                             (__normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
                              *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
          auVar8 = in_ZMM1._0_16_;
          if (!bVar1) break;
          pPVar5 = __gnu_cxx::
                   __normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
                   ::operator->(&local_e8);
          auVar8 = vcvtusi2sd_avx512f(auVar8,local_6c);
          auVar9._8_8_ = 0x7fffffffffffffff;
          auVar9._0_8_ = 0x7fffffffffffffff;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = pPVar5->y - auVar8._0_8_;
          auVar8 = vpand_avx(auVar6,auVar9);
          in_ZMM1 = ZEXT1664(ZEXT816(0x3ff0000000000000));
          if (1.0 < auVar8._0_8_) {
            local_1 = 0;
            local_80 = 1;
            goto LAB_001875f5;
          }
          __gnu_cxx::
          __normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
          ::operator++(&local_e8);
        }
        local_f8._M_current =
             (PointBase2D<double> *)
             std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::cbegin
                       ((vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *)
                        CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        while( true ) {
          std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::cend
                    ((vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *)
                     CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
                              *)CONCAT17(in_stack_fffffffffffffeb7,
                                         CONCAT16(in_stack_fffffffffffffeb6,
                                                  CONCAT24(in_stack_fffffffffffffeb4,
                                                           in_stack_fffffffffffffeb0))),
                             (__normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
                              *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
          auVar8 = in_ZMM1._0_16_;
          if (!bVar1) break;
          pPVar5 = __gnu_cxx::
                   __normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
                   ::operator->(&local_f8);
          auVar8 = vcvtusi2sd_avx512f(auVar8,local_78);
          auVar10._8_8_ = 0x7fffffffffffffff;
          auVar10._0_8_ = 0x7fffffffffffffff;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = pPVar5->y - auVar8._0_8_;
          auVar8 = vpand_avx(auVar7,auVar10);
          in_ZMM1 = ZEXT1664(ZEXT816(0x3ff0000000000000));
          if (1.0 < auVar8._0_8_) {
            local_1 = 0;
            local_80 = 1;
            goto LAB_001875f5;
          }
          __gnu_cxx::
          __normal_iterator<const_PointBase2D<double>_*,_std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>_>
          ::operator++(&local_f8);
        }
        local_80 = 0;
      }
      else {
        local_1 = 0;
        local_80 = 1;
      }
LAB_001875f5:
      EdgeDetectionBase<double>::~EdgeDetectionBase
                ((EdgeDetectionBase<double> *)
                 CONCAT17(in_stack_fffffffffffffeb7,
                          CONCAT16(in_stack_fffffffffffffeb6,
                                   CONCAT24(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0))));
    }
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x18760f);
    if ((local_80 != 0) && (local_80 == 1)) goto LAB_0018765c;
    in_stack_fffffffffffffecc = local_80;
  }
  local_1 = 1;
LAB_0018765c:
  return (bool)(local_1 & 1);
}

Assistant:

bool DetectVerticalEdge()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            PenguinV_Image::Image image = Unit_Test::blackImage();

            uint32_t roiX, roiY;
            uint32_t roiWidth, roiHeight;
            Unit_Test::generateRoi( image, roiX, roiY, roiWidth, roiHeight );

            const uint32_t roiYEnd = roiY + roiHeight;
            const bool isValidTopEdge    = ( roiY > 1u ) && ( roiY    + 1u < image.height() );
            const bool isValidBottomEdge = ( roiY > 0u ) && ( roiYEnd + 2u < image.height() );

            if ( !isValidTopEdge && !isValidBottomEdge )
                continue;

            Unit_Test::fillImage( image, roiX, roiY, roiWidth, roiHeight, Unit_Test::randomValue<uint8_t>( 64, 256 ) );

            EdgeDetectionBase<_Type> edgeDetection;
            edgeDetection.find( image, EdgeParameter( EdgeParameter::TOP_TO_BOTTOM) );

            const std::vector< PointBase2D<_Type> > & positive = edgeDetection.positiveEdge();
            const std::vector< PointBase2D<_Type> > & negative = edgeDetection.negativeEdge();

            if ( ( isValidTopEdge && (positive.size() != roiWidth) ) || ( isValidBottomEdge && (negative.size() != roiWidth) ) )
                return false;

            for ( typename std::vector< PointBase2D<_Type> >::const_iterator point = positive.cbegin(); point != positive.cend(); ++point ) {
                if ( fabs( point->y - roiY ) > 1.0 )
                    return false;
            }

            for ( typename std::vector< PointBase2D<_Type> >::const_iterator point = negative.cbegin(); point != negative.cend(); ++point ) {
                if ( fabs( point->y - roiYEnd ) > 1.0 )
                    return false;
            }
        }

        return true;
    }